

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

Result __thiscall
spectest::JSONParser::ParseKeyStringValue(JSONParser *this,char *key,string *out_string)

{
  Result RVar1;
  
  out_string->_M_string_length = 0;
  *(out_string->_M_dataplus)._M_p = '\0';
  RVar1 = ExpectKey(this,key);
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  RVar1 = ParseString(this,out_string);
  return (Result)RVar1.enum_;
}

Assistant:

wabt::Result JSONParser::ParseKeyStringValue(const char* key,
                                             std::string* out_string) {
  out_string->clear();
  EXPECT_KEY(key);
  return ParseString(out_string);
}